

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  logic_error *this;
  allocator local_39;
  string local_38 [32];
  
  pIVar2 = getCurrentMutableContext();
  iVar1 = (*(pIVar2->super_IContext)._vptr_IContext[2])(pIVar2);
  if ((IResultCapture *)CONCAT44(extraout_var,iVar1) != (IResultCapture *)0x0) {
    return (IResultCapture *)CONCAT44(extraout_var,iVar1);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"No result capture instance",&local_39);
  std::logic_error::logic_error(this,local_38);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

IContext& getCurrentContext() {
        return getCurrentMutableContext();
    }